

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_platform.cpp
# Opt level: O3

char * crnlib_strnlwr(char *p,size_t n)

{
  int iVar1;
  size_t sVar2;
  
  if (n != 0) {
    sVar2 = 0;
    do {
      if (p[sVar2] == '\0') {
        return p;
      }
      iVar1 = tolower((int)p[sVar2]);
      p[sVar2] = (char)iVar1;
      sVar2 = sVar2 + 1;
    } while (n != sVar2);
  }
  return p;
}

Assistant:

char* crnlib_strnlwr(char* p, size_t n) {
  char* q = p;
  for (size_t i = 0; i < n && *q; i++) {
    char c = *q;
    *q++ = tolower(c);
  }
  return p;
}